

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O1

void av1_lowbd_fwd_txfm2d_8x8_sse2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  int *piVar2;
  byte bVar3;
  code *pcVar4;
  code *pcVar5;
  undefined8 uVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  int8_t *piVar16;
  ulong uVar17;
  uint uVar18;
  undefined7 in_register_00000009;
  undefined8 *puVar19;
  long lVar20;
  undefined8 *puVar21;
  undefined4 uVar22;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined4 uVar27;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar29 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 uVar45;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined4 uVar54;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  __m128i buf0 [8];
  __m128i buf1 [8];
  undefined8 auStack_148 [2];
  undefined8 local_138 [2];
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined1 local_118 [16];
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined1 local_f8 [16];
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined1 local_d8 [16];
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined8 local_b8 [5];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar28 [12];
  undefined1 auVar33 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [12];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  
  piVar16 = av1_fwd_txfm_shift_ls[1];
  puVar21 = local_138;
  uVar17 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    lVar20 = 0x80;
    do {
      uVar6 = *(undefined8 *)(input + 4);
      *(undefined8 *)((long)auStack_148 + lVar20) = *(undefined8 *)input;
      *(undefined8 *)((long)auStack_148 + lVar20 + 8) = uVar6;
      input = input + stride;
      lVar20 = lVar20 + -0x10;
    } while (lVar20 != 0);
  }
  else {
    lVar20 = 0;
    do {
      uVar6 = *(undefined8 *)(input + 4);
      *(undefined8 *)((long)local_138 + lVar20) = *(undefined8 *)input;
      *(undefined8 *)((long)local_138 + lVar20 + 8) = uVar6;
      lVar20 = lVar20 + 0x10;
      input = input + stride;
    } while (lVar20 != 0x80);
  }
  pcVar4 = *(code **)((long)col_txfm8x8_arr + uVar17);
  bVar3 = *av1_fwd_txfm_shift_ls[1];
  uVar18 = (uint)(char)bVar3;
  if ((int)uVar18 < 0) {
    auVar29 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
    auVar29 = pshuflw(auVar29,auVar29,0);
    auVar29._4_4_ = auVar29._0_4_;
    auVar29._8_4_ = auVar29._0_4_;
    auVar29._12_4_ = auVar29._0_4_;
    lVar20 = 0;
    do {
      auVar35 = paddsw(*(undefined1 (*) [16])((long)local_138 + lVar20),auVar29);
      auVar35 = psraw(auVar35,ZEXT416(-uVar18));
      *(undefined1 (*) [16])((long)local_138 + lVar20) = auVar35;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  else if (bVar3 != 0) {
    lVar20 = 0;
    do {
      auVar29 = psllw(*(undefined1 (*) [16])((long)local_138 + lVar20),ZEXT416(uVar18));
      *(undefined1 (*) [16])((long)local_138 + lVar20) = auVar29;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  pcVar5 = *(code **)((long)row_txfm8x8_arr + uVar17);
  auStack_148[1] = 0x4c45b3;
  (*pcVar4)(local_138,local_138,0xd);
  bVar3 = piVar16[1];
  uVar18 = (uint)(char)bVar3;
  if ((int)uVar18 < 0) {
    auVar29 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
    auVar29 = pshuflw(auVar29,auVar29,0);
    auVar35._0_4_ = auVar29._0_4_;
    auVar35._4_4_ = auVar35._0_4_;
    auVar35._8_4_ = auVar35._0_4_;
    auVar35._12_4_ = auVar35._0_4_;
    lVar20 = 0;
    do {
      auVar29 = paddsw(*(undefined1 (*) [16])((long)local_138 + lVar20),auVar35);
      auVar29 = psraw(auVar29,ZEXT416(-uVar18));
      *(undefined1 (*) [16])((long)local_138 + lVar20) = auVar29;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  else if (bVar3 != 0) {
    lVar20 = 0;
    do {
      auVar29 = psllw(*(undefined1 (*) [16])((long)local_138 + lVar20),ZEXT416(uVar18));
      *(undefined1 (*) [16])((long)local_138 + lVar20) = auVar29;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  auVar39._0_12_ = local_138._0_12_;
  auVar39._12_2_ = local_138[0]._6_2_;
  auVar39._14_2_ = uStack_122;
  auVar38._12_4_ = auVar39._12_4_;
  auVar38._0_10_ = local_138._0_10_;
  auVar38._10_2_ = uStack_124;
  auVar37._10_6_ = auVar38._10_6_;
  auVar37._0_8_ = local_138[0];
  auVar37._8_2_ = local_138[0]._4_2_;
  auVar11._4_8_ = auVar37._8_8_;
  auVar11._2_2_ = uStack_126;
  auVar11._0_2_ = local_138[0]._2_2_;
  auVar36._0_4_ = CONCAT22(local_128,(short)local_138[0]);
  auVar36._4_12_ = auVar11;
  auVar52._0_12_ = local_118._0_12_;
  auVar52._12_2_ = local_118._6_2_;
  auVar52._14_2_ = uStack_102;
  auVar51._12_4_ = auVar52._12_4_;
  auVar51._0_10_ = local_118._0_10_;
  auVar51._10_2_ = uStack_104;
  auVar50._10_6_ = auVar51._10_6_;
  auVar50._0_8_ = local_118._0_8_;
  auVar50._8_2_ = local_118._4_2_;
  auVar12._4_8_ = auVar50._8_8_;
  auVar12._2_2_ = uStack_106;
  auVar12._0_2_ = local_118._2_2_;
  auVar44._0_12_ = local_f8._0_12_;
  auVar44._12_2_ = local_f8._6_2_;
  auVar44._14_2_ = uStack_e2;
  auVar43._12_4_ = auVar44._12_4_;
  auVar43._0_10_ = local_f8._0_10_;
  auVar43._10_2_ = uStack_e4;
  auVar42._10_6_ = auVar43._10_6_;
  auVar42._0_8_ = local_f8._0_8_;
  auVar42._8_2_ = local_f8._4_2_;
  auVar13._4_8_ = auVar42._8_8_;
  auVar13._2_2_ = uStack_e6;
  auVar13._0_2_ = local_f8._2_2_;
  auVar41._0_4_ = CONCAT22(local_e8,local_f8._0_2_);
  auVar41._4_12_ = auVar13;
  auVar60._0_12_ = local_d8._0_12_;
  auVar60._12_2_ = local_d8._6_2_;
  auVar60._14_2_ = uStack_c2;
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = local_d8._0_10_;
  auVar59._10_2_ = uStack_c4;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = local_d8._0_8_;
  auVar58._8_2_ = local_d8._4_2_;
  auVar14._4_8_ = auVar58._8_8_;
  auVar14._2_2_ = uStack_c6;
  auVar14._0_2_ = local_d8._2_2_;
  uVar22 = CONCAT22(uStack_120,(short)local_138[1]);
  auVar23._0_8_ = CONCAT26(uStack_11e,CONCAT24(local_138[1]._2_2_,uVar22));
  auVar23._8_2_ = local_138[1]._4_2_;
  auVar23._10_2_ = uStack_11c;
  auVar24._12_2_ = local_138[1]._6_2_;
  auVar24._0_12_ = auVar23;
  auVar24._14_2_ = uStack_11a;
  uVar45 = CONCAT22(uStack_100,local_118._8_2_);
  auVar46._0_8_ = CONCAT26(uStack_fe,CONCAT24(local_118._10_2_,uVar45));
  auVar46._8_2_ = local_118._12_2_;
  auVar46._10_2_ = uStack_fc;
  auVar47._12_2_ = local_118._14_2_;
  auVar47._0_12_ = auVar46;
  auVar47._14_2_ = uStack_fa;
  uVar27 = CONCAT22(uStack_e0,local_f8._8_2_);
  auVar28._0_8_ = CONCAT26(uStack_de,CONCAT24(local_f8._10_2_,uVar27));
  auVar28._8_2_ = local_f8._12_2_;
  auVar28._10_2_ = uStack_dc;
  auVar30._12_2_ = local_f8._14_2_;
  auVar30._0_12_ = auVar28;
  auVar30._14_2_ = uStack_da;
  uVar54 = CONCAT22(uStack_c0,local_d8._8_2_);
  auVar55._0_8_ = CONCAT26(uStack_be,CONCAT24(local_d8._10_2_,uVar54));
  auVar55._8_2_ = local_d8._12_2_;
  auVar55._10_2_ = uStack_bc;
  auVar56._12_2_ = local_d8._14_2_;
  auVar56._0_12_ = auVar55;
  auVar56._14_2_ = uStack_ba;
  auVar48._0_8_ = auVar36._0_8_;
  auVar48._8_4_ = auVar11._0_4_;
  auVar48._12_4_ = auVar12._0_4_;
  auVar49._0_8_ = auVar41._0_8_;
  auVar49._8_4_ = auVar13._0_4_;
  auVar49._12_4_ = auVar14._0_4_;
  auVar53._8_4_ = (int)((ulong)auVar23._0_8_ >> 0x20);
  auVar53._0_8_ = auVar23._0_8_;
  auVar53._12_4_ = (int)((ulong)auVar46._0_8_ >> 0x20);
  auVar57._8_4_ = (int)((ulong)auVar28._0_8_ >> 0x20);
  auVar57._0_8_ = auVar28._0_8_;
  auVar57._12_4_ = (int)((ulong)auVar55._0_8_ >> 0x20);
  auVar40._0_8_ = CONCAT44(auVar50._8_4_,auVar37._8_4_);
  auVar40._8_4_ = auVar38._12_4_;
  auVar40._12_4_ = auVar51._12_4_;
  auVar25._0_8_ = CONCAT44(auVar46._8_4_,auVar23._8_4_);
  auVar25._8_4_ = auVar24._12_4_;
  auVar25._12_4_ = auVar47._12_4_;
  local_b8[0] = CONCAT44(CONCAT22(local_108,local_118._0_2_),auVar36._0_4_);
  local_b8[1] = CONCAT44(CONCAT22(local_c8,local_d8._0_2_),auVar41._0_4_);
  local_b8[2] = auVar48._8_8_;
  local_b8[3] = auVar49._8_8_;
  local_b8[4] = auVar40._0_8_;
  uStack_90 = auVar42._8_4_;
  uStack_8c = auVar58._8_4_;
  local_88 = auVar40._8_8_;
  local_78 = CONCAT44(uVar45,uVar22);
  uStack_70 = CONCAT44(uVar54,uVar27);
  local_68 = auVar53._8_8_;
  uStack_60 = auVar57._8_8_;
  local_58 = auVar25._0_8_;
  uStack_50 = auVar28._8_4_;
  uStack_4c = auVar55._8_4_;
  local_48 = auVar25._8_8_;
  uStack_38 = auVar30._12_4_;
  uStack_34 = auVar56._12_4_;
  if (tx_type < 0x10 && (0x7f1fU >> (tx_type & 0x1f) & 1) == 0) {
    lVar20 = 0x80;
    puVar19 = local_b8;
    do {
      uVar6 = puVar19[1];
      *(undefined8 *)((long)auStack_148 + lVar20) = *puVar19;
      *(undefined8 *)((long)auStack_148 + lVar20 + 8) = uVar6;
      puVar19 = puVar19 + 2;
      lVar20 = lVar20 + -0x10;
    } while (lVar20 != 0);
  }
  else {
    puVar21 = local_b8;
  }
  auStack_148[1] = 0x4c477c;
  (*pcVar5)(puVar21,puVar21,0xd);
  auVar31._8_8_ = extraout_XMM1_Qb;
  auVar31._0_8_ = extraout_XMM1_Qa;
  bVar3 = piVar16[2];
  if ((char)bVar3 < '\0') {
    auVar29 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
    auVar29 = pshuflw(auVar29,auVar29,0);
    auVar26._0_4_ = auVar29._0_4_;
    auVar26._4_4_ = auVar26._0_4_;
    auVar26._8_4_ = auVar26._0_4_;
    auVar26._12_4_ = auVar26._0_4_;
    lVar20 = 0;
    auVar31 = ZEXT416((uint)-(int)(char)bVar3);
    do {
      auVar29 = paddsw(*(undefined1 (*) [16])((long)puVar21 + lVar20),auVar26);
      auVar29 = psraw(auVar29,auVar31);
      *(undefined1 (*) [16])((long)puVar21 + lVar20) = auVar29;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  else if (bVar3 != 0) {
    lVar20 = 0;
    do {
      auVar31 = psllw(*(undefined1 (*) [16])((long)puVar21 + lVar20),ZEXT416((uint)(int)(char)bVar3)
                     );
      *(undefined1 (*) [16])((long)puVar21 + lVar20) = auVar31;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  lVar20 = 0;
  do {
    psVar1 = (short *)((long)puVar21 + lVar20);
    sVar7 = psVar1[4];
    sVar8 = psVar1[5];
    sVar9 = psVar1[6];
    sVar10 = psVar1[7];
    auVar34._0_12_ = auVar31._0_12_;
    auVar34._12_2_ = auVar31._6_2_;
    auVar34._14_2_ = psVar1[3];
    auVar33._12_4_ = auVar34._12_4_;
    auVar33._0_10_ = auVar31._0_10_;
    auVar33._10_2_ = psVar1[2];
    auVar32._10_6_ = auVar33._10_6_;
    auVar32._0_8_ = auVar31._0_8_;
    auVar32._8_2_ = auVar31._4_2_;
    auVar15._4_8_ = auVar32._8_8_;
    auVar15._2_2_ = psVar1[1];
    auVar15._0_2_ = auVar31._2_2_;
    auVar31._0_4_ = (int)*psVar1;
    auVar31._4_4_ = auVar15._0_4_ >> 0x10;
    auVar31._8_4_ = auVar32._8_4_ >> 0x10;
    auVar31._12_4_ = auVar33._12_4_ >> 0x10;
    *(undefined1 (*) [16])((long)output + lVar20 * 2) = auVar31;
    piVar2 = (int *)((long)output + lVar20 * 2 + 0x10);
    *piVar2 = (int)sVar7;
    piVar2[1] = (int)sVar8;
    piVar2[2] = (int)sVar9;
    piVar2[3] = (int)sVar10;
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x80);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_8x8_sse2(const int16_t *input, int32_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[8], buf1[8], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X8];
  const int txw_idx = get_txw_idx(TX_8X8);
  const int txh_idx = get_txh_idx(TX_8X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 8;
  const transform_1d_sse2 col_txfm = col_txfm8x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x8_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip)
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  else
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_buffer_16bit_to_32bit_w8(buf, output, height, width);
}